

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

Time __thiscall helics::TimeCoordinator::getTimeProperty(TimeCoordinator *this,int timeProperty)

{
  if (timeProperty == 0x89) {
    return (Time)(this->info).timeDelta.internalTimeCode;
  }
  if (timeProperty == 0x8c) {
    return (Time)(this->info).period.internalTimeCode;
  }
  if (timeProperty == 0x8d) {
    return (Time)(this->info).offset.internalTimeCode;
  }
  if (timeProperty != 0x94) {
    if (timeProperty == 0x96) {
      return (Time)(this->info).outputDelay.internalTimeCode;
    }
    return (Time)-0x7fffffffffffffff;
  }
  return (Time)(this->info).inputDelay.internalTimeCode;
}

Assistant:

Time TimeCoordinator::getTimeProperty(int timeProperty) const
{
    switch (timeProperty) {
        case defs::Properties::OUTPUT_DELAY:
            return info.outputDelay;
        case defs::Properties::INPUT_DELAY:
            return info.inputDelay;
        case defs::Properties::TIME_DELTA:
            return info.timeDelta;
        case defs::Properties::PERIOD:
            return info.period;
        case defs::Properties::OFFSET:
            return info.offset;
        default:
            return Time::minVal();
    }
}